

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_aligned.h
# Opt level: O1

void __thiscall
embree::avx::HeuristicArrayBinningSAH<embree::PrimRef,_32UL>::splitByGeometry
          (HeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *range,
          PrimInfoRange *linfo,PrimInfoRange *rinfo)

{
  PrimRef *pPVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  float fVar4;
  float fVar5;
  PrimRef *pPVar6;
  unsigned_long uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  PrimRef *pPVar19;
  unsigned_long uVar20;
  PrimRef *pPVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  pPVar6 = this->prims;
  pPVar19 = pPVar6 + range->_begin;
  fVar4 = pPVar6[range->_begin].lower.field_0.m128[3];
  pPVar21 = pPVar6 + range->_end;
  aVar24.m128[2] = INFINITY;
  aVar24._0_8_ = 0x7f8000007f800000;
  aVar24.m128[3] = INFINITY;
  aVar23.m128[2] = -INFINITY;
  aVar23._0_8_ = 0xff800000ff800000;
  aVar23.m128[3] = -INFINITY;
  aVar22 = aVar23;
  aVar8 = aVar23;
  aVar10 = aVar24;
  aVar25 = aVar24;
  aVar11 = aVar24;
  aVar9 = aVar23;
  while( true ) {
    pPVar1 = pPVar21 + -1;
    while ((pPVar19 <= pPVar1 && ((pPVar19->lower).field_0.m128[3] == fVar4))) {
      aVar2 = (pPVar19->lower).field_0.field_1;
      aVar3 = (pPVar19->upper).field_0.field_1;
      aVar10.m128 = (__m128)vminps_avx(aVar10.m128,(undefined1  [16])aVar2);
      aVar8.m128 = (__m128)vmaxps_avx(aVar8.m128,(undefined1  [16])aVar3);
      auVar26._0_4_ = aVar2.x + aVar3.x;
      auVar26._4_4_ = aVar2.y + aVar3.y;
      auVar26._8_4_ = aVar2.z + aVar3.z;
      auVar26._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
      aVar11.m128 = (__m128)vminps_avx(aVar11.m128,auVar26);
      aVar9.m128 = (__m128)vmaxps_avx(aVar9.m128,auVar26);
      pPVar19 = pPVar19 + 1;
    }
    if (pPVar1 < pPVar19) break;
    fVar5 = pPVar21[-1].lower.field_0.m128[3];
    pPVar21 = pPVar1;
    while (fVar5 != fVar4) {
      aVar2 = (pPVar21->lower).field_0.field_1;
      aVar3 = (pPVar21->upper).field_0.field_1;
      aVar25.m128 = (__m128)vminps_avx(aVar25.m128,(undefined1  [16])aVar2);
      aVar22.m128 = (__m128)vmaxps_avx(aVar22.m128,(undefined1  [16])aVar3);
      auVar27._0_4_ = aVar2.x + aVar3.x;
      auVar27._4_4_ = aVar2.y + aVar3.y;
      auVar27._8_4_ = aVar2.z + aVar3.z;
      auVar27._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
      aVar24.m128 = (__m128)vminps_avx(aVar24.m128,auVar27);
      aVar23.m128 = (__m128)vmaxps_avx(aVar23.m128,auVar27);
      if (pPVar21 + -1 < pPVar19) goto LAB_002ea811;
      fVar5 = pPVar21[-1].lower.field_0.m128[3];
      pPVar21 = pPVar21 + -1;
    }
    if (pPVar21 < pPVar19) break;
    aVar2 = (pPVar21->lower).field_0.field_1;
    aVar3 = (pPVar21->upper).field_0.field_1;
    aVar10.m128 = (__m128)vminps_avx(aVar10.m128,(undefined1  [16])aVar2);
    aVar8.m128 = (__m128)vmaxps_avx(aVar8.m128,(undefined1  [16])aVar3);
    auVar28._0_4_ = aVar2.x + aVar3.x;
    auVar28._4_4_ = aVar2.y + aVar3.y;
    auVar28._8_4_ = aVar2.z + aVar3.z;
    auVar28._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar11.m128 = (__m128)vminps_avx(aVar11.m128,auVar28);
    aVar9.m128 = (__m128)vmaxps_avx(aVar9.m128,auVar28);
    aVar2 = (pPVar19->lower).field_0.field_1;
    aVar3 = (pPVar19->upper).field_0.field_1;
    aVar25.m128 = (__m128)vminps_avx(aVar25.m128,(undefined1  [16])aVar2);
    aVar22.m128 = (__m128)vmaxps_avx(aVar22.m128,(undefined1  [16])aVar3);
    auVar29._0_4_ = aVar2.x + aVar3.x;
    auVar29._4_4_ = aVar2.y + aVar3.y;
    auVar29._8_4_ = aVar2.z + aVar3.z;
    auVar29._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar24.m128 = (__m128)vminps_avx(aVar24.m128,auVar29);
    aVar23.m128 = (__m128)vmaxps_avx(aVar23.m128,auVar29);
    uVar12 = *(undefined8 *)&(pPVar19->lower).field_0;
    uVar13 = *(undefined8 *)((long)&(pPVar19->lower).field_0 + 8);
    uVar14 = *(undefined8 *)&(pPVar19->upper).field_0;
    uVar15 = *(undefined8 *)((long)&(pPVar19->upper).field_0 + 8);
    uVar16 = *(undefined8 *)((long)&(pPVar21->lower).field_0 + 8);
    uVar17 = *(undefined8 *)&(pPVar21->upper).field_0;
    uVar18 = *(undefined8 *)((long)&(pPVar21->upper).field_0 + 8);
    *(undefined8 *)&(pPVar19->lower).field_0 = *(undefined8 *)&(pPVar21->lower).field_0;
    *(undefined8 *)((long)&(pPVar19->lower).field_0 + 8) = uVar16;
    *(undefined8 *)&(pPVar19->upper).field_0 = uVar17;
    *(undefined8 *)((long)&(pPVar19->upper).field_0 + 8) = uVar18;
    *(undefined8 *)&(pPVar21->lower).field_0 = uVar12;
    *(undefined8 *)((long)&(pPVar21->lower).field_0 + 8) = uVar13;
    *(undefined8 *)&(pPVar21->upper).field_0 = uVar14;
    *(undefined8 *)((long)&(pPVar21->upper).field_0 + 8) = uVar15;
    pPVar19 = pPVar19 + 1;
  }
LAB_002ea811:
  uVar20 = (long)pPVar19 - (long)pPVar6 >> 5;
  uVar7 = range->_begin;
  (linfo->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar10;
  (linfo->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar8;
  (linfo->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar11;
  (linfo->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar9;
  (linfo->super_range<unsigned_long>)._begin = uVar7;
  (linfo->super_range<unsigned_long>)._end = uVar20;
  uVar7 = range->_end;
  (rinfo->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar25;
  (rinfo->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar22;
  (rinfo->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar24;
  (rinfo->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar23;
  (rinfo->super_range<unsigned_long>)._begin = uVar20;
  (rinfo->super_range<unsigned_long>)._end = uVar7;
  return;
}

Assistant:

void splitByGeometry(const range<size_t>& range, PrimInfoRange& linfo, PrimInfoRange& rinfo)
        {
          assert(range.size() > 1);
          CentGeomBBox3fa left(empty);
          CentGeomBBox3fa right(empty);
          unsigned int geomID = prims[range.begin()].geomID();
          size_t center = serial_partitioning(prims,range.begin(),range.end(),left,right,
                                              [&] ( const PrimRef& prim ) { return prim.geomID() == geomID; },
                                              [ ] ( CentGeomBBox3fa& a, const PrimRef& ref ) { a.extend_center2(ref); });

          new (&linfo) PrimInfoRange(range.begin(),center,left);
          new (&rinfo) PrimInfoRange(center,range.end(),right);
        }